

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_array.c
# Opt level: O1

void assert_is_array(cJSON *array_item)

{
  if (array_item == (cJSON *)0x0) {
    UnityFail("Item is NULL.",0x23);
  }
  if (array_item->next != (cJSON *)0x0) {
    UnityFail("Linked list next pointer is not NULL.",0x25);
  }
  if (array_item->prev != (cJSON *)0x0) {
    UnityFail("Linked list previous pointer is not NULL.",0x25);
  }
  UnityAssertBits(0xff,0x20,(long)array_item->type,"Item doesn\'t have expected type.",0x26);
  UnityAssertBits(0x100,0,(long)array_item->type,"Item should not have a string as reference.",0x27)
  ;
  UnityAssertBits(0x200,0,(long)array_item->type,"Item should not have a const string.",0x28);
  if (array_item->valuestring != (char *)0x0) {
    UnityFail("Valuestring is not NULL.",0x29);
  }
  if (array_item->string != (char *)0x0) {
    UnityFail("String is not NULL.",0x2a);
    return;
  }
  return;
}

Assistant:

static void assert_is_array(cJSON *array_item)
{
    TEST_ASSERT_NOT_NULL_MESSAGE(array_item, "Item is NULL.");

    assert_not_in_list(array_item);
    assert_has_type(array_item, cJSON_Array);
    assert_has_no_reference(array_item);
    assert_has_no_const_string(array_item);
    assert_has_no_valuestring(array_item);
    assert_has_no_string(array_item);
}